

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBitPatterns.cpp
# Opt level: O0

bool anon_unknown.dwarf_b732e::equalBitPatterns(char *b1,char *b2)

{
  bool bVar1;
  char *b2_local;
  char *b1_local;
  
  b2_local = b2;
  b1_local = b1;
  while( true ) {
    bVar1 = false;
    if (*b1_local != '\0') {
      bVar1 = *b2_local != '\0';
    }
    if (!bVar1) break;
    if (((*b1_local != *b2_local) && (*b1_local != 'X')) && (*b2_local != 'X')) {
      return false;
    }
    b1_local = b1_local + 1;
    b2_local = b2_local + 1;
  }
  bVar1 = true;
  if (*b1_local == '\0') {
    bVar1 = *b2_local != '\0';
  }
  return (bool)(bVar1 ^ 1);
}

Assistant:

bool
equalBitPatterns (const char* b1, const char* b2)
{
    //
    // Returns true if the characters in zero-terminated string b1
    // are the same as the charaters in string b2, except for places
    // where b1 or b2 contains an 'X'.  For example:
    //
    //	equalBitPatterns ("100", "100") returns true
    //	equalBitPatterns ("100", "101") returns false
    //	equalBitPatterns ("10X", "101") returns true
    //	equalBitPatterns ("10X", "100") returns true
    //

    while (*b1 && *b2)
    {
        if (*b1 != *b2 && *b1 != 'X' && *b2 != 'X') return false;

        ++b1;
        ++b2;
    }

    return !(*b1 || *b2);
}